

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O1

void * worker_thread_get(void *arg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uStack_1a0;
  undefined1 uStack_191;
  uint *puStack_190;
  ulong *puStack_188;
  ulong uStack_180;
  code *pcStack_178;
  ulong uStack_170;
  void *pvStack_168;
  size_t *psStack_160;
  undefined1 *puStack_158;
  code *pcStack_150;
  char *local_148;
  undefined1 local_138 [8];
  char vbuf [256];
  size_t vsize;
  
  vbuf[0xf8] = '\0';
  vbuf[0xf9] = '\0';
  vbuf[0xfa] = '\0';
  vbuf[0xfb] = '\0';
  vbuf[0xfc] = '\0';
  vbuf[0xfd] = '\0';
  vbuf[0xfe] = '\0';
  vbuf[0xff] = '\0';
  vsize = 1;
  if (*(uint *)((long)arg + 0x1c) < 2) {
    return (void *)0x0;
  }
  do {
    puVar5 = *(uint **)((long)arg + 8);
    pcStack_150 = (code *)0x103b69;
    local_148 = vbuf + 0xf8;
    lVar4 = vmemcache_get(puVar5,&vsize,8,local_138,0x100,0);
    if (lVar4 == -1) {
      pcStack_150 = worker_thread_put_in_gets;
      worker_thread_get_cold_1();
      uVar2 = (*puVar5 & 1) + puVar5[7];
      uStack_170 = (ulong)uVar2;
      uVar1 = puVar5[7] * 3;
      if (uVar1 <= uVar2) {
        return (void *)0x0;
      }
      pvStack_168 = arg;
      psStack_160 = &vsize;
      puStack_158 = local_138;
      pcStack_150 = (code *)&stack0xfffffffffffffff8;
      do {
        puVar6 = *(uint **)(puVar5 + 2);
        lVar4 = (uStack_170 % (ulong)puVar5[6]) * 0x10;
        pcStack_178 = (code *)0x103beb;
        iVar3 = vmemcache_put(puVar6,&uStack_170,8,
                              *(undefined8 *)(*(long *)(puVar5 + 4) + 8 + lVar4),
                              *(undefined8 *)(*(long *)(puVar5 + 4) + lVar4));
        if (iVar3 != 0) {
          pcStack_178 = worker_thread_test_evict_get;
          worker_thread_put_in_gets_cold_1();
          uStack_1a0 = (ulong)*puVar6;
          puStack_190 = puVar5;
          puStack_188 = &uStack_170;
          uStack_180 = (ulong)uVar1;
          pcStack_178 = (code *)&pcStack_150;
          do {
            if (keep_running == 0) {
              return (void *)0x0;
            }
            lVar4 = vmemcache_get(*(undefined8 *)(puVar6 + 2),&uStack_1a0,8,&uStack_191,1,0,0);
          } while (lVar4 == 1);
          return (void *)0x0;
        }
        uStack_170 = uStack_170 + 2;
      } while (uStack_170 < uVar1);
      return (void *)0x0;
    }
    vsize = vsize + 1;
  } while (vsize < *(uint *)((long)arg + 0x1c));
  return (void *)0x0;
}

Assistant:

static void *
worker_thread_get(void *arg)
{
	struct context *ctx = arg;
	unsigned long long i;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	/* starting from 1, because the entry #0 has been evicted */
	for (i = 1; i < ctx->ops_count; i++) {
		if (vmemcache_get(ctx->cache, &i, sizeof(i),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}